

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

shared_ptr<GenApi_3_4::CChunkAdapter>
rcg::getChunkAdapter(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,string *tltype)

{
  bool bVar1;
  CChunkAdapterGEV *this;
  CChunkAdapterU3V *this_00;
  CChunkAdapterGeneric *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  shared_ptr<GenApi_3_4::CChunkAdapter> sVar4;
  shared_ptr<GenApi_3_4::CChunkAdapter> *chunkadapter;
  bool in_stack_00000126;
  bool in_stack_00000127;
  char *in_stack_00000128;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_00000130;
  CChunkAdapterGeneric *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  
  std::shared_ptr<GenApi_3_4::CChunkAdapter>::shared_ptr
            ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x134479);
  bVar1 = setBoolean(in_stack_00000130,in_stack_00000128,in_stack_00000127,in_stack_00000126);
  _Var3._M_pi = extraout_RDX;
  if (bVar1) {
    bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if (bVar1) {
      this = (CChunkAdapterGEV *)operator_new(0x18);
      peVar2 = std::
               __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1344ec);
      GenApi_3_4::CChunkAdapterGEV::CChunkAdapterGEV
                (this,(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1);
      std::shared_ptr<GenApi_3_4::CChunkAdapter>::shared_ptr<GenApi_3_4::CChunkAdapterGEV,void>
                ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff60,
                 (CChunkAdapterGEV *)in_stack_ffffffffffffff58);
      std::shared_ptr<GenApi_3_4::CChunkAdapter>::operator=
                ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff60,
                 (shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff58);
      std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x13452d);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      if (bVar1) {
        this_00 = (CChunkAdapterU3V *)operator_new(0x18);
        peVar2 = std::
                 __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1345ad);
        GenApi_3_4::CChunkAdapterU3V::CChunkAdapterU3V
                  (this_00,(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
                   -1);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::shared_ptr<GenApi_3_4::CChunkAdapterU3V,void>
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff60,
                   (CChunkAdapterU3V *)in_stack_ffffffffffffff58);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::operator=
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff60,
                   (shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff58);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x1345ee);
        _Var3._M_pi = extraout_RDX_01;
      }
      else {
        this_01 = (CChunkAdapterGeneric *)operator_new(0x18);
        peVar2 = std::
                 __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x134631);
        GenApi_3_4::CChunkAdapterGeneric::CChunkAdapterGeneric
                  (this_01,(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
                   -1);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::
        shared_ptr<GenApi_3_4::CChunkAdapterGeneric,void>
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)this_01,in_stack_ffffffffffffff58);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::operator=
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)this_01,
                   (shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff58);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x134672);
        _Var3._M_pi = extraout_RDX_02;
      }
    }
  }
  sVar4.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar4.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<GenApi_3_4::CChunkAdapter>)
         sVar4.super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenApi::CChunkAdapter> getChunkAdapter(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap,
                                                       const std::string &tltype)
{
  std::shared_ptr<GenApi::CChunkAdapter> chunkadapter;

  if (setBoolean(nodemap, "ChunkModeActive", true))
  {
    if (tltype == "GEV")
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGEV(nodemap->_Ptr));
    }
    else if (tltype == "U3V")
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterU3V(nodemap->_Ptr));
    }
    else
    {
      chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGeneric(nodemap->_Ptr));
    }
  }

  return chunkadapter;
}